

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoreboard.cpp
# Opt level: O0

void CScoreboard::ConKeyScoreboard(IResult *pResult,void *pUserData)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int Result;
  CScoreboard *pScoreboard;
  
  iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,0);
  if (iVar1 == 0) {
    *(undefined1 *)(in_RSI + 0x11) = 0;
    *(undefined1 *)(in_RSI + 0x10) = 0;
  }
  else if ((*(byte *)(in_RSI + 0x10) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0x11) = 1;
  }
  return;
}

Assistant:

void CScoreboard::ConKeyScoreboard(IConsole::IResult *pResult, void *pUserData)
{
	CScoreboard *pScoreboard = (CScoreboard *)pUserData;
	int Result = pResult->GetInteger(0);
	if(!Result)
	{
		pScoreboard->m_Activate = false;
		pScoreboard->m_Active = false;
	}
	else if(!pScoreboard->m_Active)
		pScoreboard->m_Activate = true;	
}